

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rapass.cpp
# Opt level: O3

Error __thiscall asmjit::v1_14::BaseRAPass::buildCFGViews(BaseRAPass *this)

{
  ZoneAllocator *allocator;
  uint *puVar1;
  int *piVar2;
  ulong *puVar3;
  Platform PVar4;
  FormatFlags FVar5;
  long lVar6;
  FuncNode *pFVar7;
  ArchTraits *pAVar8;
  BaseEmitter *pBVar9;
  BaseNode *pBVar10;
  bool bVar11;
  byte bVar12;
  Error EVar13;
  uint uVar14;
  uint uVar15;
  RABlock *pRVar16;
  undefined8 extraout_RAX;
  BaseNode *pBVar17;
  BaseRAPass *pBVar18;
  RABlock *pRVar19;
  undefined1 *puVar20;
  undefined4 extraout_var;
  byte bVar21;
  char c;
  long *plVar22;
  _func_int *p_Var23;
  BaseNode *pBVar24;
  char *pcVar25;
  BaseRAPass *pBVar26;
  long *plVar27;
  long lVar28;
  int iVar29;
  BaseBuilder *pBVar30;
  uint *puVar31;
  Logger *this_00;
  BaseRAPass *pBVar32;
  char *this_01;
  RegGroup group;
  uint uVar33;
  EncodingOptions EVar34;
  long lVar35;
  BaseNode *pBVar36;
  BaseRAPass *pBVar37;
  BaseRAPass *pBVar38;
  uint32_t *puVar39;
  BaseRAPass *pBVar40;
  uint64_t uVar41;
  BaseNode **ppBVar42;
  uint32_t uVar43;
  uint uVar44;
  BaseRAPass *unaff_R13;
  ulong uVar45;
  BaseRAPass *pBVar46;
  ulong uVar47;
  BaseRAPass *pBVar48;
  float in_XMM0_Da;
  float fVar49;
  float __x;
  float extraout_XMM0_Da;
  float __x_00;
  float __x_01;
  EncodingOptions EVar50;
  InstOptions IVar51;
  uint uVar52;
  EncodingOptions EVar53;
  InstOptions IVar54;
  uint uVar55;
  InstOptions IVar56;
  RABlockVisitItem RVar57;
  ZoneStack<asmjit::v1_14::RABlockVisitItem> stack;
  undefined1 auStack_e30 [32];
  undefined1 auStack_e10 [1032];
  BaseRAPass *pBStack_a08;
  RABlock *pRStack_a00;
  BaseRAPass *pBStack_9f8;
  BaseRAPass *pBStack_9f0;
  BaseRAPass *pBStack_9e8;
  BaseRAPass *pBStack_9e0;
  BaseRAPass *pBStack_9d0;
  RABlock *pRStack_9c8;
  BaseRAPass *pBStack_9c0;
  BaseRAPass *pBStack_9b8;
  BaseRAPass *pBStack_9b0;
  BaseRAPass *pBStack_9a8;
  ulong uStack_998;
  BaseRAPass *pBStack_990;
  BaseRAPass *pBStack_988;
  uint *puStack_980;
  BaseRAPass *pBStack_978;
  undefined1 auStack_970 [40];
  BaseNode **ppBStack_948;
  BaseRAPass *pBStack_940;
  BaseRAPass *pBStack_938;
  RABlock *pRStack_930;
  ulong uStack_928;
  BaseRAPass *pBStack_920;
  uint64_t uStack_918;
  undefined1 auStack_910 [16];
  ZoneVectorBase ZStack_900;
  undefined1 auStack_8f0 [16];
  ZoneVectorBase ZStack_8e0;
  undefined8 uStack_8d0;
  InstOptions IStack_8c8;
  uint uStack_8c4;
  ulong uStack_8c0;
  BaseNode *pBStack_8b8;
  String SStack_8b0;
  undefined1 auStack_8af [15];
  char *pcStack_8a0;
  BaseRAPass *pBStack_898;
  undefined1 uStack_890;
  BaseRAPass *pBStack_688;
  BaseRAPass *pBStack_680;
  ulong uStack_678;
  BaseRAPass *pBStack_670;
  BaseRAPass *pBStack_668;
  BaseNode *pBStack_660;
  undefined4 uStack_658;
  int iStack_654;
  BaseRAPass *pBStack_650;
  ulong uStack_648;
  BaseRAPass *pBStack_640;
  ulong uStack_638;
  BaseRAPass *pBStack_630;
  BaseNode *pBStack_628;
  ulong uStack_620;
  BaseRAPass *pBStack_618;
  ulong uStack_610;
  uint64_t uStack_608;
  FormatOptions *pFStack_600;
  BaseNode *pBStack_5f8;
  undefined4 uStack_5f0;
  undefined4 uStack_5ec;
  undefined4 uStack_5e8;
  undefined4 uStack_5e4;
  undefined8 uStack_5e0;
  undefined1 *puStack_5d8;
  undefined1 auStack_5d0 [264];
  Logger *pLStack_4c8;
  ZoneAllocator *pZStack_4c0;
  ZoneStack<asmjit::v1_14::RABlockVisitItem> local_498;
  Logger *local_480;
  undefined1 local_478 [32];
  undefined1 local_458 [32];
  undefined1 local_438 [1032];
  
  if ((this->_diagnosticOptions & kRADebugCFG) == kNone) {
    this_00 = (Logger *)0x0;
  }
  else {
    this_00 = this->_logger;
  }
  if (this_00 != (Logger *)0x0) {
    Logger::logf(this_00,in_XMM0_Da);
  }
  uVar33 = *(uint *)&this->field_0xb8;
  pBVar17 = (BaseNode *)(ulong)uVar33;
  if (uVar33 == 0) {
    return 0;
  }
  allocator = &this->_allocator;
  if ((*(uint *)&this->field_0xdc < uVar33) &&
     (EVar13 = ZoneVectorBase::_reserve((ZoneVectorBase *)&this->_pov,allocator,8,uVar33),
     EVar13 != 0)) {
    return EVar13;
  }
  local_498._0_8_ = 0;
  local_498._8_8_ = 0;
  local_498._16_8_ = 0;
  EVar13 = ZoneStackBase::_init(&local_498.super_ZoneStackBase,allocator,0x110);
  if (EVar13 == 0) {
    pBVar32 = (BaseRAPass *)local_478;
    local_478._0_8_ = (_func_int **)0x0;
    local_478._8_8_ = (BaseBuilder *)0x0;
    EVar13 = ZoneBitVector::_resize((ZoneBitVector *)pBVar32,allocator,uVar33,uVar33,false);
    if (EVar13 == 0) {
      local_480 = this_00;
      local_478._24_8_ = allocator;
      if (*(int *)&this->field_0xb8 == 0) {
        buildCFGViews();
        uVar45 = (ulong)*(uint *)&pBVar32->field_0xb8;
        if (*(uint *)&pBVar32->field_0xb8 != *(uint *)&pBVar32->field_0xd8) {
          fVar49 = 0.0;
          puStack_5d8 = auStack_5d0;
          uStack_5ec = 0;
          uStack_5e8 = 0;
          uStack_5e4 = 0;
          uStack_5f0 = 0x20;
          uStack_5e0 = 0x107;
          auStack_5d0[0] = 0;
          if ((pBVar32->_diagnosticOptions & kRADebugUnreachable) == kNone) {
            pBVar46 = (BaseRAPass *)0x0;
          }
          else {
            pBVar46 = (BaseRAPass *)pBVar32->_logger;
          }
          pBVar37 = pBVar32;
          pLStack_4c8 = this_00;
          pZStack_4c0 = allocator;
          if (pBVar46 != (BaseRAPass *)0x0) {
            pBStack_628 = (BaseNode *)0x124e7a;
            pBVar37 = pBVar46;
            fVar49 = Logger::logf((Logger *)pBVar46,0.0);
          }
          if (uVar45 != 0) {
            pFStack_600 = &pBVar32->_formatOptions;
            uVar47 = 0;
            uStack_620 = uVar45;
            do {
              if (*(uint *)&pBVar32->field_0xb8 <= uVar47) {
                pBStack_628 = (BaseNode *)buildCFGDominators;
                removeUnreachableCode();
                pBStack_628 = pBVar17;
                pBStack_630 = pBVar46;
                uStack_638 = uVar47;
                pBStack_640 = unaff_R13;
                uStack_648 = uVar45;
                pBStack_650 = pBVar32;
                _uStack_658 = extraout_RAX;
                if ((pBVar37->_diagnosticOptions & kRADebugCFG) == kNone) {
                  pBVar32 = (BaseRAPass *)0x0;
                }
                else {
                  pBVar32 = (BaseRAPass *)pBVar37->_logger;
                }
                pBVar48 = pBVar37;
                fVar49 = __x_00;
                if (pBVar32 != (BaseRAPass *)0x0) {
                  pBStack_660 = (BaseNode *)0x125016;
                  pBVar48 = pBVar32;
                  fVar49 = Logger::logf((Logger *)pBVar32,__x_00);
                }
                if (*(int *)&pBVar37->field_0xb8 == 0) {
                  return 0;
                }
                pBVar40 = (BaseRAPass *)**(undefined8 **)&(pBVar37->_blocks).field_0x0;
                *(BaseRAPass **)&pBVar40->field_0x50 = pBVar40;
                iVar29 = 0;
                goto LAB_00125035;
              }
              unaff_R13 = *(BaseRAPass **)(*(long *)&(pBVar32->_blocks).field_0x0 + uVar47 * 8);
              if ((((BaseEmitter *)&unaff_R13->super_FuncPass)->_validationFlags & 2) == kNone) {
                if (pBVar46 != (BaseRAPass *)0x0) {
                  pBStack_628 = (BaseNode *)0x124ed4;
                  pBVar37 = pBVar46;
                  fVar49 = Logger::logf((Logger *)pBVar46,fVar49);
                }
                pBVar17 = *(BaseNode **)
                           &((BaseEmitter *)&unaff_R13->super_FuncPass)->_diagnosticOptions;
                uStack_608 = *(uint64_t *)pBVar17;
                pBVar24 = *(BaseNode **)(*(uint64_t *)&unaff_R13->_allocator + 8);
                pBVar36 = pBVar17;
                pBStack_618 = unaff_R13;
                uStack_610 = uVar47;
                pBVar10 = pBVar24;
                if (pBVar17 != pBVar24) {
                  do {
                    pBStack_5f8 = pBVar10;
                    pBVar17 = *(BaseNode **)(pBVar36 + 8);
                    if (((byte)pBVar36[0x11] & 9) != 0) {
                      if (pBVar46 != (BaseRAPass *)0x0) {
                        pBStack_628 = (BaseNode *)0x124f1f;
                        String::clear((String *)&uStack_5f0);
                        pBStack_628 = (BaseNode *)0x124f36;
                        Formatter::formatNode
                                  ((String *)&uStack_5f0,pFStack_600,
                                   *(BaseBuilder **)
                                    &((BaseEmitter *)&pBVar32->super_FuncPass)->_emitterType,pBVar36
                                  );
                        pBStack_628 = (BaseNode *)0x124f5b;
                        Logger::logf((Logger *)pBVar46,__x);
                        unaff_R13 = pBVar32;
                        pBVar24 = pBStack_5f8;
                      }
                      pBVar37 = *(BaseRAPass **)
                                 &((BaseEmitter *)&pBVar32->super_FuncPass)->_emitterType;
                      pBStack_628 = (BaseNode *)0x124f6f;
                      BaseBuilder::removeNode((BaseBuilder *)pBVar37,pBVar36);
                      fVar49 = extraout_XMM0_Da;
                    }
                    pBVar36 = pBVar17;
                    pBVar10 = pBStack_5f8;
                  } while (pBVar17 != pBVar24);
                }
                uVar45 = uStack_620;
                uVar47 = uStack_610;
                if (*(BaseNode **)(uStack_608 + 8) == pBVar24) {
                  fVar49 = 0.0;
                  ((BaseEmitter *)&pBStack_618->super_FuncPass)->_diagnosticOptions = kNone;
                  *(undefined4 *)&((BaseEmitter *)&pBStack_618->super_FuncPass)->field_0x14 = 0;
                  *(undefined4 *)&pBStack_618->_allocator = 0;
                  *(undefined4 *)&pBStack_618->field_0x1c = 0;
                }
                else {
                  *(BaseNode **)&((BaseEmitter *)&pBStack_618->super_FuncPass)->_diagnosticOptions =
                       *(BaseNode **)(uStack_608 + 8);
                  *(uint64_t *)&pBStack_618->_allocator = *(uint64_t *)pBVar24;
                }
              }
              uVar47 = uVar47 + 1;
            } while (uVar47 != uVar45);
          }
          pBStack_628 = (BaseNode *)0x124fc5;
          String::reset((String *)&uStack_5f0);
        }
        return 0;
      }
      pRVar16 = (RABlock *)**(long **)&this->_blocks;
      uVar33 = 0;
      do {
        if (uVar33 < *(uint *)(pRVar16 + 0x70)) {
          do {
            pRVar19 = *(RABlock **)(*(long *)(pRVar16 + 0x68) + (ulong)uVar33 * 8);
            uVar14 = *(uint *)(pRVar19 + 8);
            if ((uint)local_478._8_4_ <= uVar14) {
              buildCFGViews();
LAB_00124db6:
              buildCFGViews();
LAB_00124dbb:
              buildCFGViews();
              goto LAB_00124dc0;
            }
            uVar33 = uVar33 + 1;
            if (((ulong)*(_func_int **)(local_478._0_8_ + (ulong)(uVar14 >> 6) * 8) >>
                 ((ulong)uVar14 & 0x3f) & 1) == 0) {
              *(_func_int **)(local_478._0_8_ + (ulong)(uVar14 >> 6) * 8) =
                   (_func_int *)
                   ((ulong)*(_func_int **)(local_478._0_8_ + (ulong)(uVar14 >> 6) * 8) |
                   1L << ((byte)uVar14 & 0x3f));
              if (local_498._0_8_ == 0) goto LAB_00124dbb;
              plVar22 = *(long **)(local_498._16_8_ + 0x18);
              if ((long *)(local_498._16_8_ + 0x1f0) < plVar22) {
                EVar13 = ZoneStackBase::_prepareBlock(&local_498.super_ZoneStackBase,1,0x20);
                if (EVar13 != 0) goto LAB_00124b26;
                plVar22 = *(long **)(local_498._16_8_ + 0x18);
              }
              if ((plVar22 < (long *)(local_498._16_8_ + 0x20)) ||
                 ((long *)(local_498._16_8_ + 0x1f0) < plVar22)) goto LAB_00124db6;
              *plVar22 = (long)pRVar16;
              *(uint *)(plVar22 + 1) = uVar33;
              *(long **)(local_498._16_8_ + 0x18) = plVar22 + 2;
              uVar33 = 0;
              pRVar16 = pRVar19;
            }
          } while (uVar33 < *(uint *)(pRVar16 + 0x70));
        }
        pRVar16[0xc] = (RABlock)((byte)pRVar16[0xc] | 2);
        uVar33 = *(uint *)&this->field_0xd8;
        *(uint *)(pRVar16 + 0x2c) = uVar33;
        if (*(uint *)&this->field_0xdc <= uVar33) {
LAB_00124dc0:
          buildCFGViews();
LAB_00124dc5:
          buildCFGViews();
          return 0;
        }
        *(RABlock **)(*(long *)&this->_pov + (ulong)uVar33 * 8) = pRVar16;
        *(int *)&this->field_0xd8 = *(int *)&this->field_0xd8 + 1;
        if (local_498._0_8_ == 0) goto LAB_00124dc5;
        if (*(long *)(local_498._8_8_ + 0x10) == *(long *)(local_498._16_8_ + 0x18))
        goto LAB_00124c9b;
        RVar57 = ZoneStack<asmjit::v1_14::RABlockVisitItem>::pop(&local_498);
        pRVar16 = RVar57._block;
        uVar33 = RVar57._index;
      } while( true );
    }
  }
LAB_00124b26:
  ZoneStackBase::_init(&local_498.super_ZoneStackBase,(ZoneAllocator *)0x0,0);
  return EVar13;
LAB_001252a2:
  pBVar18 = pBVar37;
  if (uVar33 < *(uint *)&pBVar48->field_0xd8) {
    uStack_8c0 = (ulong)uVar33;
    this_01 = *(char **)(*(long *)&(pBVar48->_pov).field_0x0 + (ulong)uVar33 * 8);
    uVar43 = (uint32_t)pRVar16;
    pBStack_9a8 = (BaseRAPass *)0x1252dd;
    EVar13 = ZoneBitVector::_resize
                       ((ZoneBitVector *)&((BaseRAPass *)this_01)->_iEmitHelper,
                        (ZoneAllocator *)
                        (((BaseEmitter *)&((BaseRAPass *)this_01)->super_FuncPass)->
                         _vptr_BaseEmitter + 3),uVar43,uVar43,false);
    if (EVar13 == 0) {
      pBStack_9a8 = (BaseRAPass *)0x125301;
      EVar13 = ZoneBitVector::_resize
                         ((ZoneBitVector *)&((BaseRAPass *)this_01)->_formatOptions,
                          (ZoneAllocator *)
                          (((BaseEmitter *)&((BaseRAPass *)this_01)->super_FuncPass)->
                           _vptr_BaseEmitter + 3),uVar43,uVar43,false);
      if (EVar13 == 0) {
        pBStack_940 = (BaseRAPass *)&((BaseRAPass *)this_01)->_func;
        pBStack_9a8 = (BaseRAPass *)0x12532a;
        EVar13 = ZoneBitVector::_resize
                           ((ZoneBitVector *)pBStack_940,
                            (ZoneAllocator *)
                            (((BaseEmitter *)&((BaseRAPass *)this_01)->super_FuncPass)->
                             _vptr_BaseEmitter + 3),uVar43,uVar43,false);
        if (EVar13 == 0) {
          pBVar40 = (BaseRAPass *)&((BaseRAPass *)this_01)->_extraBlock;
          pBStack_9a8 = (BaseRAPass *)0x125353;
          ppBStack_948 = (BaseNode **)pBVar40;
          EVar13 = ZoneBitVector::_resize
                             ((ZoneBitVector *)pBVar40,
                              (ZoneAllocator *)
                              (((BaseEmitter *)&((BaseRAPass *)this_01)->super_FuncPass)->
                               _vptr_BaseEmitter + 3),uVar43,uVar43,false);
          if (EVar13 == 0) {
            pBVar17 = *(BaseNode **)
                       &((BaseEmitter *)&((BaseRAPass *)this_01)->super_FuncPass)->
                        _diagnosticOptions;
            pBVar24 = *(BaseNode **)&((BaseRAPass *)this_01)->_allocator;
            iVar29 = 0;
            pBStack_8b8 = pBVar17;
            pBVar18 = (BaseRAPass *)this_01;
            puVar31 = puStack_980;
            ppBVar42 = ppBStack_948;
            pBStack_978 = (BaseRAPass *)this_01;
            do {
              if (((byte)pBVar24[0x11] & 0x20) != 0) {
                uStack_928 = CONCAT44(uStack_928._4_4_,iVar29);
                uStack_8d0 = pBVar24;
                uVar41 = *(uint64_t *)(pBVar24 + 0x20);
                if (uVar41 == 0) goto LAB_001260f9;
                uStack_998 = (ulong)*(uint *)(uVar41 + 0x10);
                if (uStack_998 != 0) {
                  uStack_998 = uStack_998 << 5;
                  pBVar46 = (BaseRAPass *)0x0;
                  uStack_918 = uVar41;
                  do {
                    uVar33 = *(uint *)((long)pBVar46 + uVar41 + 0x4c);
                    this_01 = (char *)(ulong)uVar33;
                    if (ZStack_8e0._size <= uVar33) {
                      pBStack_9a8 = (BaseRAPass *)0x1259e6;
                      buildLiveness();
LAB_001259e6:
                      pBStack_9a8 = (BaseRAPass *)0x1259eb;
                      buildLiveness();
LAB_001259eb:
                      pBStack_9a8 = (BaseRAPass *)0x1259f0;
                      buildLiveness();
LAB_001259f0:
                      pBStack_9a8 = (BaseRAPass *)0x1259f5;
                      buildLiveness();
LAB_001259f5:
                      pBStack_9a8 = (BaseRAPass *)0x1259fa;
                      buildLiveness();
                      goto LAB_001259fa;
                    }
                    *(int *)((long)ZStack_8e0._data + (long)this_01 * 4) =
                         *(int *)((long)ZStack_8e0._data + (long)this_01 * 4) + 1;
                    if (ZStack_900._size <= uVar33) goto LAB_001259e6;
                    uVar14 = *(uint *)((long)pBVar46 + 0x54 + uVar41);
                    piVar2 = (int *)((long)ZStack_900._data + (long)this_01 * 4);
                    *piVar2 = *piVar2 + (uint)((uVar14 >> 1 & 1) != 0);
                    if (*(uint *)&(pBVar18->_blocks).field_0x0 <= uVar33) goto LAB_001259eb;
                    pBVar17 = *ppBVar42;
                    pBVar37 = (BaseRAPass *)(1L << ((byte)uVar33 & 0x3f));
                    pBVar32 = (BaseRAPass *)(ulong)(uVar33 >> 6);
                    p_Var23 = *(_func_int **)(pBVar17 + (long)pBVar32 * 8);
                    uVar44 = 0x40000;
                    if (((ulong)p_Var23 >> ((ulong)this_01 & 0x3f) & 1) == 0) {
                      if (uVar33 < *(uint *)&pBVar18->_stop) {
                        if (((ulong)((BaseEmitter *)&pBStack_940->super_FuncPass)->_vptr_BaseEmitter
                                    [(long)pBVar32] & (ulong)pBVar37) == 0) {
                          uVar44 = 0x20000;
                          goto LAB_00125434;
                        }
                        goto LAB_0012545c;
                      }
LAB_001260e5:
                      pBStack_9a8 = (BaseRAPass *)0x1260ea;
                      buildLiveness();
                      goto LAB_001260ea;
                    }
LAB_00125434:
                    uVar14 = uVar14 | uVar44;
                    *(uint *)((long)pBVar46 + 0x54 + uVar41) = uVar14;
LAB_0012545c:
                    pBVar17 = pBVar17 + (long)pBVar32 * 8;
                    if ((uVar14 & 3) != 2) {
                      *(_func_int **)pBVar17 = (_func_int *)((ulong)p_Var23 & ~(ulong)pBVar37);
                      if (uVar33 < *(uint *)&pBVar18->_stop) {
                        pBVar17 = (BaseNode *)
                                  (((BaseEmitter *)&pBStack_940->super_FuncPass)->_vptr_BaseEmitter
                                  + (long)pBVar32);
                        p_Var23 = *(_func_int **)pBVar17;
                        goto LAB_00125492;
                      }
                      pBStack_9a8 = (BaseRAPass *)0x1260e0;
                      buildLiveness();
LAB_001260e0:
                      pBStack_9a8 = (BaseRAPass *)0x1260e5;
                      buildLiveness();
                      goto LAB_001260e5;
                    }
LAB_00125492:
                    *(_func_int **)pBVar17 = (_func_int *)((ulong)p_Var23 | (ulong)pBVar37);
                    if ((uVar14 >> 0xc & 1) != 0) {
                      if (*puVar31 <= uVar33) goto LAB_001260e0;
                      puVar1 = (uint *)(*(long *)(*(long *)&(pBVar48->_workRegs).field_0x0 +
                                                 (long)this_01 * 8) + 0x24);
                      *puVar1 = *puVar1 | 0x10;
                    }
                    uVar14 = *(uint *)((long)pBVar46 + 0x50 + uVar41);
                    if ((ulong)uVar14 != 0xffffffff) {
                      if (*puVar31 <= uVar14) goto LAB_001259f0;
                      pBVar48 = *(BaseRAPass **)
                                 (*(long *)&(pBVar48->_workRegs).field_0x0 + (ulong)uVar14 * 8);
                      pBVar40 = (BaseRAPass *)&(pBVar48->_formatOptions)._padding;
                      uVar14 = *(uint *)&pBVar48->_func;
                      if (uVar14 <= uVar33) {
                        pBStack_9a8 = (BaseRAPass *)0x125500;
                        EVar13 = ZoneBitVector::_resize
                                           ((ZoneBitVector *)pBVar40,(ZoneAllocator *)pBStack_990,
                                            uVar33 + 1,uVar33 + 1,false);
                        if (EVar13 != 0) goto LAB_00125258;
                        uVar14 = *(uint *)&pBVar48->_func;
                        uVar41 = uStack_918;
                        pBVar18 = pBStack_978;
                        puVar31 = puStack_980;
                        ppBVar42 = ppBStack_948;
                        pRVar16 = (RABlock *)pBVar40;
                      }
                      if (uVar33 < uVar14) {
                        puVar3 = (ulong *)(*(long *)((Array<unsigned_short,_2UL> *)pBVar40)->_data +
                                          (long)pBVar32 * 8);
                        *puVar3 = *puVar3 | (ulong)pBVar37;
                        pBVar48 = pBStack_988;
                        goto LAB_0012553d;
                      }
                      goto LAB_001259f5;
                    }
LAB_0012553d:
                    pBVar46 = (BaseRAPass *)((long)pBVar46 + 0x20);
                  } while ((BaseRAPass *)uStack_998 != pBVar46);
                }
                iVar29 = (int)uStack_928 + 1;
                pBVar17 = pBStack_8b8;
                pBVar24 = uStack_8d0;
                pRVar16 = pRStack_930;
                pBVar32 = pBStack_990;
              }
              if (pBVar24 == pBVar17) goto LAB_0012558e;
              pBVar24 = *(BaseNode **)pBVar24;
              if (pBVar24 == (BaseNode *)0x0) {
LAB_001260ea:
                pBStack_9a8 = (BaseRAPass *)0x1260ef;
                buildLiveness();
                goto LAB_001260ef;
              }
            } while( true );
          }
        }
      }
    }
    goto LAB_00125258;
  }
  goto LAB_00126169;
LAB_0012558e:
  uVar33._0_1_ = *(EmitterType *)&(pBVar18->super_FuncPass).super_Pass._cb;
  uVar33._1_1_ = *(EmitterFlags *)((long)&(pBVar18->super_FuncPass).super_Pass._cb + 1);
  uVar33._2_1_ = *(uint8_t *)((long)&(pBVar18->super_FuncPass).super_Pass._cb + 2);
  uVar33._3_1_ = *(uint8_t *)((long)&(pBVar18->super_FuncPass).super_Pass._cb + 3);
  if ((uint)auStack_910._8_4_ <= uVar33) goto LAB_0012619b;
  *(int *)(auStack_910._0_8_ + (ulong)uVar33 * 4) = iVar29;
  uVar33 = (int)uStack_8c0 + 1;
  if (uVar33 == auStack_970._32_4_) goto LAB_001255be;
  goto LAB_001252a2;
LAB_001255be:
  auStack_970._0_16_ = (undefined1  [16])0x0;
  auStack_970._16_8_ = (char *)0x0;
  auStack_8f0 = (undefined1  [16])0x0;
  pBStack_9a8 = (BaseRAPass *)0x1255e9;
  EVar13 = ZoneStackBase::_init((ZoneStackBase *)auStack_970,(ZoneAllocator *)pBVar32,0x110);
  if (EVar13 == 0) {
    pBVar40 = (BaseRAPass *)auStack_8f0;
    pBStack_9a8 = (BaseRAPass *)0x12560c;
    EVar13 = ZoneBitVector::_resize
                       ((ZoneBitVector *)pBVar40,(ZoneAllocator *)pBVar32,
                        *(uint32_t *)&pBVar48->field_0xb8,*(uint32_t *)&pBVar48->field_0xb8,true);
    pBVar46 = (BaseRAPass *)auStack_970._32_8_;
    if (EVar13 == 0) {
      uStack_998 = CONCAT44(uStack_998._4_4_,(int)pRVar16 + 0x3fU >> 6);
      if ((int)auStack_970._32_8_ != 0) {
        pBVar32 = (BaseRAPass *)0x0;
        this_01 = auStack_970;
        do {
          pBVar18 = pBVar37;
          if ((BaseRAPass *)(ulong)*(uint *)&pBVar48->field_0xd8 <= pBVar32) goto LAB_0012616e;
          pBVar37 = *(BaseRAPass **)(*(long *)&pBVar48->_pov + (long)pBVar32 * 8);
          pBStack_9a8 = (BaseRAPass *)0x125673;
          pBVar40 = pBVar37;
          LiveOps::recalcInOut((RABlock *)pBVar37,(uint32_t)uStack_998,true);
          pBVar18 = pBVar37;
          if ((_func_int **)auStack_970._0_8_ == (_func_int **)0x0) goto LAB_00126173;
          pcVar25 = *(char **)(auStack_970._16_8_ + 0x18);
          if ((char *)(auStack_970._16_8_ + 0x1f8) < pcVar25) {
            pBStack_9a8 = (BaseRAPass *)0x1256a6;
            pBVar40 = (BaseRAPass *)this_01;
            EVar13 = ZoneStackBase::_prepareBlock((ZoneStackBase *)this_01,1,0x20);
            if (EVar13 != 0) goto LAB_00125610;
            pcVar25 = *(char **)(auStack_970._16_8_ + 0x18);
          }
          if ((pcVar25 < (char *)(auStack_970._16_8_ + 0x20)) ||
             ((char *)(auStack_970._16_8_ + 0x1f8) < pcVar25)) goto LAB_00126146;
          *(BaseRAPass **)pcVar25 = pBVar37;
          *(char **)(auStack_970._16_8_ + 0x18) = pcVar25 + 8;
          pBVar32 = (BaseRAPass *)
                    ((long)&((BaseEmitter *)&pBVar32->super_FuncPass)->_vptr_BaseEmitter + 1);
        } while (pBVar46 != pBVar32);
      }
LAB_001257fc:
      pBVar18 = pBVar37;
      if ((_func_int **)auStack_970._0_8_ != (_func_int **)0x0) {
        if (*(long *)&((BaseEmitter *)auStack_970._8_8_)->_diagnosticOptions !=
            *(long *)(auStack_970._16_8_ + 0x18)) {
          pBStack_9a8 = (BaseRAPass *)0x1256fa;
          pBVar18 = (BaseRAPass *)
                    ZoneStack<asmjit::v1_14::RABlock_*>::popFirst
                              ((ZoneStack<asmjit::v1_14::RABlock_*> *)auStack_970);
          uVar43._0_1_ = *(EmitterType *)&(pBVar18->super_FuncPass).super_Pass._cb;
          uVar43._1_1_ = *(EmitterFlags *)((long)&(pBVar18->super_FuncPass).super_Pass._cb + 1);
          uVar43._2_1_ = *(uint8_t *)((long)&(pBVar18->super_FuncPass).super_Pass._cb + 2);
          uVar43._3_1_ = *(uint8_t *)((long)&(pBVar18->super_FuncPass).super_Pass._cb + 3);
          pBStack_9a8 = (BaseRAPass *)0x12570f;
          ZoneBitVector::setBit((ZoneBitVector *)auStack_8f0,uVar43,false);
          pBStack_9a8 = (BaseRAPass *)0x12571d;
          pBVar40 = pBVar18;
          bVar11 = LiveOps::recalcInOut((RABlock *)pBVar18,(uint32_t)uStack_998,false);
          if ((!bVar11) ||
             (pBVar32 = (BaseRAPass *)(ulong)*(uint *)&pBVar18->field_0x60,
             pBVar32 == (BaseRAPass *)0x0)) goto LAB_001257f9;
          pRVar16 = (RABlock *)0x0;
LAB_00125735:
          if (pRVar16 < (RABlock *)(ulong)*(uint *)&pBVar18->field_0x60) {
            this_01 = *(char **)((long)*(RegOnly *)&pBVar18->field_0x58 + (long)pRVar16 * 8);
            FVar5._0_1_ = *(EmitterType *)&(((BaseRAPass *)this_01)->super_FuncPass).super_Pass._cb;
            FVar5._1_1_ = *(EmitterFlags *)
                           ((long)&(((BaseRAPass *)this_01)->super_FuncPass).super_Pass._cb + 1);
            FVar5._2_1_ = *(uint8_t *)
                           ((long)&(((BaseRAPass *)this_01)->super_FuncPass).super_Pass._cb + 2);
            FVar5._3_1_ = *(uint8_t *)
                           ((long)&(((BaseRAPass *)this_01)->super_FuncPass).super_Pass._cb + 3);
            if ((uint)auStack_8f0._8_4_ <= FVar5) goto LAB_001260f4;
            uVar45 = *(ulong *)(&((FormatOptions *)(auStack_8f0._0_8_ + 8))->_indentation +
                               (ulong)(FVar5 >> 6) * 2 + -3);
            pBVar40 = (BaseRAPass *)(1L << ((undefined1)FVar5 & 0x3f));
            if ((uVar45 >> ((ulong)FVar5 & 0x3f) & 1) != 0) goto LAB_001257ed;
            *(ulong *)(&((FormatOptions *)(auStack_8f0._0_8_ + 8))->_indentation +
                      (ulong)(FVar5 >> 6) * 2 + -3) = uVar45 | (ulong)pBVar40;
            if ((_func_int **)auStack_970._0_8_ == (_func_int **)0x0) goto LAB_0012614b;
            pcVar25 = *(char **)(auStack_970._16_8_ + 0x18);
            if ((char *)(auStack_970._16_8_ + 0x1f8) < pcVar25) {
              pBVar40 = (BaseRAPass *)auStack_970;
              pBStack_9a8 = (BaseRAPass *)0x1257b4;
              EVar13 = ZoneStackBase::_prepareBlock((ZoneStackBase *)pBVar40,1,0x20);
              if (EVar13 != 0) goto LAB_00125610;
              pcVar25 = *(char **)(auStack_970._16_8_ + 0x18);
            }
            if (((char *)(auStack_970._16_8_ + 0x20) <= pcVar25) &&
               (pcVar25 <= (char *)(auStack_970._16_8_ + 0x1f8))) {
              *(char **)pcVar25 = this_01;
              *(char **)(auStack_970._16_8_ + 0x18) = pcVar25 + 8;
              goto LAB_001257ed;
            }
            pBStack_9a8 = (BaseRAPass *)0x126132;
            buildLiveness();
LAB_00126132:
            pBStack_9a8 = (BaseRAPass *)0x126137;
            buildLiveness();
LAB_00126137:
            pBStack_9a8 = (BaseRAPass *)0x12613c;
            buildLiveness();
LAB_0012613c:
            pBStack_9a8 = (BaseRAPass *)0x126141;
            buildLiveness();
LAB_00126141:
            pBStack_9a8 = (BaseRAPass *)0x126146;
            buildLiveness();
            goto LAB_00126146;
          }
LAB_001260ef:
          pBStack_9a8 = (BaseRAPass *)0x1260f4;
          buildLiveness();
LAB_001260f4:
          pBStack_9a8 = (BaseRAPass *)0x1260f9;
          buildLiveness();
LAB_001260f9:
          pBStack_9a8 = (BaseRAPass *)0x1260fe;
          buildLiveness();
          goto LAB_001260fe;
        }
        this_01 = auStack_970;
        pBStack_9a8 = (BaseRAPass *)0x125831;
        ZoneStackBase::_init((ZoneStackBase *)this_01,(ZoneAllocator *)0x0,0);
        pBStack_9a8 = (BaseRAPass *)0x125843;
        ZoneBitVector::release((ZoneBitVector *)auStack_8f0,(ZoneAllocator *)pBStack_990);
        pBStack_9a8 = (BaseRAPass *)0x12584f;
        pBVar40 = (BaseRAPass *)this_01;
        ZoneStackBase::_init((ZoneStackBase *)this_01,(ZoneAllocator *)0x0,0);
        if (pBStack_938 == (BaseRAPass *)0x0) goto LAB_00125917;
        pBStack_9a8 = (BaseRAPass *)0x125871;
        pBVar40 = pBStack_938;
        Logger::logf((Logger *)pBStack_938,__x_01);
        if (pBStack_920 == (BaseRAPass *)0x0) goto LAB_00125917;
        pBVar32 = (BaseRAPass *)auStack_8af;
        this_01 = "  {#%u}\n";
        pBVar46 = (BaseRAPass *)&SStack_8b0;
        pBVar37 = (BaseRAPass *)0x0;
        goto LAB_00125899;
      }
      goto LAB_00126150;
    }
  }
LAB_00125610:
  pBStack_9a8 = (BaseRAPass *)0x125620;
  ZoneStackBase::_init((ZoneStackBase *)auStack_970,(ZoneAllocator *)0x0,0);
  goto LAB_00125258;
LAB_001257ed:
  pRVar16 = pRVar16 + 1;
  if (pBVar32 == (BaseRAPass *)pRVar16) goto LAB_001257f9;
  goto LAB_00125735;
LAB_001257f9:
  pBVar46 = (BaseRAPass *)(ulong)((int)pBVar46 + 1);
  pBVar37 = pBVar18;
  goto LAB_001257fc;
LAB_00125f8a:
  *(uint *)((long)ppBVar42 + 0x34) = uVar33;
  *(EncodingOptions *)(ppBVar42 + 7) = EVar34;
  *(InstOptions *)((long)ppBVar42 + 0x3c) = IVar56;
  *(uint *)(ppBVar42 + 8) = uVar14;
  uVar44 = (pBStack_988->_globalMaxLiveCount).n._data[0];
  EVar50 = *(EncodingOptions *)((long)(pBStack_988->_globalMaxLiveCount).n._data + 4);
  IVar51 = *(InstOptions *)
            &((NodeList *)((long)(pBStack_988->_globalMaxLiveCount).n._data + 8))->field_0x0;
  uVar15 = *(uint *)((long)(pBStack_988->_globalMaxLiveCount).n._data + 0xc);
  uVar52 = -(uint)((int)(uVar33 ^ 0x80000000) < (int)(uVar44 ^ 0x80000000));
  EVar53 = -(uint)((int)(EVar34 ^ 0x80000000) < (int)(EVar50 ^ 0x80000000));
  IVar54 = -(uint)((int)(IVar56 ^ kX86_InvalidRex) < (int)(IVar51 ^ kX86_InvalidRex));
  uVar55 = -(uint)((int)(uVar14 ^ 0x80000000) < (int)(uVar15 ^ 0x80000000));
  (pBStack_988->_globalMaxLiveCount).n._data[0] = ~uVar52 & uVar33 | uVar44 & uVar52;
  *(EncodingOptions *)((long)(pBStack_988->_globalMaxLiveCount).n._data + 4) =
       ~EVar53 & EVar34 | EVar50 & EVar53;
  *(InstOptions *)&((NodeList *)((long)(pBStack_988->_globalMaxLiveCount).n._data + 8))->field_0x0 =
       ~IVar54 & IVar56 | IVar51 & IVar54;
  *(uint *)((long)(pBStack_988->_globalMaxLiveCount).n._data + 0xc) =
       ~uVar55 & uVar14 | uVar15 & uVar55;
  if ((int)uVar45 != *(int *)((long)ppBVar42 + 0x24)) goto LAB_001261b9;
LAB_00125fcf:
  pBStack_978 = (BaseRAPass *)
                ((long)&((BaseEmitter *)&pBStack_978->super_FuncPass)->_vptr_BaseEmitter + 1);
  if (pBStack_978 == pBStack_920) goto LAB_00125fea;
  goto LAB_00125a4b;
LAB_00124c9b:
  if (local_480 != (Logger *)0x0) {
    local_458._24_8_ = local_438;
    local_458._8_8_ = (BaseBuilder *)0x0;
    local_458._0_8_ = (_func_int **)0x20;
    local_458._16_8_ = (char *)0x407;
    local_438[0] = 0;
    uVar33 = *(uint *)&this->field_0xb8;
    if ((ulong)uVar33 != 0) {
      lVar6 = *(long *)&this->_blocks;
      lVar35 = 0;
      do {
        lVar28 = *(long *)(lVar6 + lVar35);
        String::clear((String *)local_458);
        if (*(int *)(lVar28 + 0x70) == 0) {
          String::_opFormat((String *)local_458,kAppend,"  #%u -> {Exit}\n",
                            (ulong)*(uint *)(lVar28 + 8));
        }
        else {
          pBVar32 = (BaseRAPass *)local_458;
          String::_opFormat((String *)local_458,kAppend,"  #%u -> {",(ulong)*(uint *)(lVar28 + 8));
          _dumpBlockIds(pBVar32,(String *)local_458,(RABlocks *)(lVar28 + 0x68));
          String::_opString((String *)local_458,kAppend,"}\n",0xffffffffffffffff);
        }
        pBVar30 = (BaseBuilder *)(local_458._0_8_ & 0xff);
        puVar20 = local_458 + 1;
        if ((BaseBuilder *)0x1e < (BaseBuilder *)(local_458._0_8_ & 0xff)) {
          pBVar30 = (BaseBuilder *)local_458._8_8_;
          puVar20 = (undefined1 *)local_458._24_8_;
        }
        (*local_480->_vptr_Logger[2])(local_480,puVar20,pBVar30);
        lVar35 = lVar35 + 8;
      } while ((ulong)uVar33 << 3 != lVar35);
    }
    String::reset((String *)local_458);
  }
  ZoneBitVector::release((ZoneBitVector *)local_478,(ZoneAllocator *)local_478._24_8_);
  EVar13 = 0;
  goto LAB_00124b26;
  while( true ) {
    iStack_654 = iVar29 + 1;
    bVar11 = false;
    do {
      uVar45 = uVar45 - 1;
      if (*(uint *)&pBVar37->field_0xd8 <= uVar45) {
        pBStack_660 = (BaseNode *)0x12512d;
        buildCFGDominators();
        pBStack_660 = pBVar17;
        pBStack_668 = pBVar46;
        pBStack_670 = pBVar37;
        uStack_678 = uVar45;
        pBStack_680 = pBVar40;
        pBStack_688 = pBVar32;
        if ((pBVar48->_diagnosticOptions >> 9 & 1) == 0) {
          this_01 = (char *)0x0;
        }
        else {
          this_01 = (char *)pBVar48->_logger;
        }
        auStack_8af = SUB1615((undefined1  [16])0x0,1);
        SStack_8b0 = (String)0x20;
        pcStack_8a0 = (char *)0x207;
        pBStack_898 = (BaseRAPass *)&uStack_890;
        uStack_890 = 0;
        if ((BaseRAPass *)this_01 == (BaseRAPass *)0x0) {
          uVar33 = *(uint *)&pBVar48->field_0x148;
          if (uVar33 == 0) goto LAB_00126126;
        }
        else {
          EVar13 = 0;
          pBStack_9a8 = (BaseRAPass *)0x125193;
          fVar49 = Logger::logf((Logger *)this_01,0.0);
          uVar33 = *(uint *)&pBVar48->field_0x148;
          if (uVar33 == 0) {
            pBStack_9a8 = (BaseRAPass *)0x1251b0;
            Logger::logf((Logger *)this_01,fVar49);
            goto LAB_00125258;
          }
        }
        pRVar16 = (RABlock *)(ulong)uVar33;
        puStack_980 = (uint *)&pBVar48->field_0x148;
        uVar14 = *(uint *)&pBVar48->field_0xb8;
        pBVar46 = (BaseRAPass *)(ulong)uVar14;
        pBVar37 = (BaseRAPass *)(ulong)*(uint *)&pBVar48->field_0xd8;
        ZStack_8e0._data = (void *)0x0;
        ZStack_8e0._size = 0;
        ZStack_8e0._capacity = 0;
        ZStack_900._data = (void *)0x0;
        ZStack_900._size = 0;
        ZStack_900._capacity = 0;
        auStack_910 = (undefined1  [16])0x0;
        pBVar32 = (BaseRAPass *)&pBVar48->_allocator;
        pBStack_9a8 = (BaseRAPass *)0x125215;
        EVar13 = ZoneVectorBase::_resize(&ZStack_8e0,(ZoneAllocator *)pBVar32,4,uVar33);
        if (EVar13 != 0) goto LAB_00125258;
        pBStack_9a8 = (BaseRAPass *)0x125236;
        auStack_970._32_8_ = pBVar37;
        EVar13 = ZoneVectorBase::_resize(&ZStack_900,(ZoneAllocator *)pBVar32,4,uVar33);
        if (EVar13 != 0) goto LAB_00125258;
        pBVar40 = (BaseRAPass *)auStack_910;
        pBStack_9a8 = (BaseRAPass *)0x125252;
        EVar13 = ZoneVectorBase::_resize
                           ((ZoneVectorBase *)pBVar40,(ZoneAllocator *)pBVar32,4,uVar14);
        if (EVar13 != 0) goto LAB_00125258;
        pBStack_938 = (BaseRAPass *)this_01;
        pRStack_930 = pRVar16;
        pBStack_920 = pBVar46;
        pBStack_990 = pBVar32;
        pBStack_988 = pBVar48;
        if (auStack_970._32_4_ == 0) goto LAB_001255be;
        uVar33 = 0;
        goto LAB_001252a2;
      }
      pBVar46 = *(BaseRAPass **)(*(long *)&(pBVar37->_pov).field_0x0 + uVar45 * 8);
      if (pBVar46 != pBVar40) {
        uVar47 = (ulong)*(uint *)&pBVar46->field_0x60;
        if (uVar47 == 0) {
          pBVar17 = (BaseNode *)0x0;
        }
        else {
          pBVar24 = (BaseNode *)0x0;
          do {
            pBVar36 = *(BaseNode **)((long)*(RegOnly *)&pBVar46->field_0x58 + -8 + uVar47 * 8);
            pBVar17 = pBVar24;
            if ((*(uint64_t *)(pBVar36 + 0x50) != 0) &&
               (pBVar17 = pBVar36, pBVar24 != (BaseNode *)0x0)) {
              while (pBVar17 = pBVar24, pBVar24 != pBVar36) {
                uVar33 = *(uint *)(pBVar36 + 0x2c);
                while( true ) {
                  uVar14 = *(uint *)(pBVar24 + 0x2c);
                  pBVar48 = (BaseRAPass *)(ulong)uVar14;
                  if (uVar33 <= uVar14) break;
                  pBVar24 = *(BaseNode **)(pBVar24 + 0x50);
                }
                while (uVar33 < uVar14) {
                  pBVar36 = *(BaseNode **)(pBVar36 + 0x50);
                  uVar33 = *(uint *)(pBVar36 + 0x2c);
                }
              }
            }
            uVar47 = uVar47 - 1;
            pBVar24 = pBVar17;
          } while (uVar47 != 0);
        }
        if (*(BaseNode **)&pBVar46->field_0x50 != pBVar17) {
          if (pBVar32 != (BaseRAPass *)0x0) {
            pBStack_660 = (BaseNode *)0x1250e6;
            pBVar48 = pBVar32;
            fVar49 = Logger::logf((Logger *)pBVar32,fVar49);
          }
          *(BaseNode **)&pBVar46->field_0x50 = pBVar17;
          bVar11 = true;
        }
      }
    } while (uVar45 != 0);
    iVar29 = iStack_654;
    if (!bVar11) break;
LAB_00125035:
    uVar45 = (ulong)*(uint *)&pBVar37->field_0xd8;
    if (uVar45 == 0) break;
  }
  if (pBVar32 != (BaseRAPass *)0x0) {
    pBStack_660 = (BaseNode *)0x125117;
    Logger::logf((Logger *)pBVar32,fVar49);
  }
  return 0;
LAB_00126146:
  pBStack_9a8 = (BaseRAPass *)0x12614b;
  buildLiveness();
LAB_0012614b:
  pBStack_9a8 = (BaseRAPass *)0x126150;
  buildLiveness();
LAB_00126150:
  pBStack_9a8 = (BaseRAPass *)0x126155;
  buildLiveness();
LAB_00126155:
  pBStack_9a8 = (BaseRAPass *)0x12615a;
  buildLiveness();
LAB_0012615a:
  pBStack_9a8 = (BaseRAPass *)0x12615f;
  buildLiveness();
LAB_0012615f:
  pBStack_9a8 = (BaseRAPass *)0x126164;
  buildLiveness();
LAB_00126164:
  pBStack_9a8 = (BaseRAPass *)0x126169;
  buildLiveness();
LAB_00126169:
  pBStack_9a8 = (BaseRAPass *)0x12616e;
  buildLiveness();
LAB_0012616e:
  pBStack_9a8 = (BaseRAPass *)0x126173;
  buildLiveness();
LAB_00126173:
  pBStack_9a8 = (BaseRAPass *)0x126178;
  buildLiveness();
LAB_00126178:
  pBStack_9a8 = (BaseRAPass *)0x12617d;
  buildLiveness();
LAB_0012617d:
  pBStack_9a8 = (BaseRAPass *)0x126182;
  buildLiveness();
LAB_00126182:
  pBStack_9a8 = (BaseRAPass *)0x126187;
  buildLiveness();
  pBVar37 = pBVar18;
LAB_00126187:
  pBStack_9a8 = (BaseRAPass *)0x12618c;
  buildLiveness();
LAB_0012618c:
  pBStack_9a8 = (BaseRAPass *)0x126191;
  buildLiveness();
LAB_00126191:
  pBStack_9a8 = (BaseRAPass *)0x126196;
  buildLiveness();
LAB_00126196:
  pBStack_9a8 = (BaseRAPass *)0x12619b;
  buildLiveness();
LAB_0012619b:
  pBStack_9a8 = (BaseRAPass *)0x1261a0;
  buildLiveness();
LAB_001261a0:
  pBStack_9a8 = (BaseRAPass *)0x1261a5;
  buildLiveness();
LAB_001261a5:
  pBStack_9a8 = (BaseRAPass *)0x1261aa;
  buildLiveness();
LAB_001261aa:
  pBStack_9a8 = (BaseRAPass *)0x1261af;
  buildLiveness();
LAB_001261af:
  pBStack_9a8 = (BaseRAPass *)0x1261b4;
  buildLiveness();
LAB_001261b4:
  pBStack_9a8 = (BaseRAPass *)0x1261b9;
  buildLiveness();
LAB_001261b9:
  pBStack_9a8 = (BaseRAPass *)assignArgIndexToWorkRegs;
  buildLiveness();
  pBVar18 = (BaseRAPass *)this_01;
  pBStack_9d0 = (BaseRAPass *)this_01;
  pRStack_9c8 = pRVar16;
  pBStack_9c0 = pBVar46;
  pBStack_9b8 = pBVar32;
  pBStack_9b0 = pBVar48;
  pBStack_9a8 = pBVar37;
  if (*(int *)&pBVar40->field_0xb8 == 0) {
LAB_0012630e:
    pBStack_9e0 = (BaseRAPass *)0x126313;
    assignArgIndexToWorkRegs();
    auStack_e30._24_8_ = auStack_e10;
    auStack_e30._8_8_ = (BaseBuilder *)0x0;
    auStack_e30._0_8_ = (_func_int **)0x20;
    auStack_e30._16_8_ = (char *)0x407;
    auStack_e10[0] = 0;
    plVar27 = *(long **)&(pBVar40->_blocks).field_0x0;
    plVar22 = plVar27 + *(uint *)&pBVar40->field_0xb8;
    pBStack_a08 = pBVar18;
    pRStack_a00 = pRVar16;
    pBStack_9f8 = pBVar46;
    pBStack_9f0 = pBVar32;
    pBStack_9e8 = pBVar48;
    pBStack_9e0 = pBVar37;
    do {
      if (plVar27 == plVar22) {
        String::reset((String *)auStack_e30);
        return 0;
      }
      pBVar17 = *(BaseNode **)(*plVar27 + 0x10);
      if (pBVar17 != (BaseNode *)0x0) {
        pBVar24 = *(BaseNode **)(*plVar27 + 0x18);
        while( true ) {
          String::clear((String *)auStack_e30);
          Formatter::formatNode
                    ((String *)auStack_e30,&pBVar40->_formatOptions,
                     *(BaseBuilder **)&((BaseEmitter *)&pBVar40->super_FuncPass)->_emitterType,
                     pBVar17);
          if (((((pBVar40->_diagnosticOptions & kRADebugLiveness) != kNone) &&
               (((byte)pBVar17[0x11] & 0x20) != 0)) &&
              (lVar6 = *(long *)(pBVar17 + 0x20), lVar6 != 0)) && (*(int *)(lVar6 + 0x10) != 0)) {
            String::padEnd((String *)auStack_e30,0x28,' ');
            pBVar32 = (BaseRAPass *)auStack_e30;
            String::_opString((String *)auStack_e30,kAppend," | ",0xffffffffffffffff);
            uVar33 = *(uint *)(lVar6 + 0x10);
            if ((ulong)uVar33 != 0) {
              lVar35 = 0;
              do {
                if (lVar35 != 0) {
                  pBVar32 = (BaseRAPass *)auStack_e30;
                  String::_opChar((String *)auStack_e30,kAppend,' ');
                }
                uVar14 = *(uint *)(lVar6 + 0x4c + lVar35);
                if (*(uint *)&pBVar40->field_0x148 <= uVar14) {
                  annotateCode();
                  EVar13 = initGlobalLiveSpans(pBVar32);
                  if (EVar13 != 0) {
                    return EVar13;
                  }
                  group = k0;
                  do {
                    EVar13 = binPack(pBVar32,group);
                    if (EVar13 != 0) {
                      return EVar13;
                    }
                    group = group + kVec;
                  } while (group != kPC);
                  return 0;
                }
                lVar28 = *(long *)(*(long *)(*(long *)&(pBVar40->_workRegs).field_0x0 +
                                            (ulong)uVar14 * 8) + 8);
                if (*(uint *)(lVar28 + 0x18) < 0xc) {
                  lVar28 = lVar28 + 0x1c;
                }
                else {
                  lVar28 = *(long *)(lVar28 + 0x20);
                }
                String::_opFormat((String *)auStack_e30,kAppend,"%s{",lVar28);
                uVar14 = *(uint *)(lVar6 + 0x54 + lVar35);
                c = 'X';
                if ((((~uVar14 & 3) != 0) && (c = 'R', (uVar14 & 1) == 0)) &&
                   (c = 'W', (uVar14 & 2) == 0)) {
                  c = '?';
                }
                String::_opChar((String *)auStack_e30,kAppend,c);
                uVar14 = *(uint *)(lVar6 + 0x54 + lVar35);
                if ((uVar14 >> 0xc & 1) != 0) {
                  String::_opFormat((String *)auStack_e30,kAppend,"|Lead[%u]",
                                    (ulong)((uVar14 >> 0xd & 3) + 1));
                }
                if (*(char *)(lVar6 + 0x5a + lVar35) == -1) {
                  if ((*(byte *)(lVar6 + 0x54 + lVar35) & 4) != 0) {
                    String::_opString((String *)auStack_e30,kAppend,"|Use",0xffffffffffffffff);
                  }
                }
                else {
                  String::_opFormat((String *)auStack_e30,kAppend,"|Use=%u");
                }
                uVar14 = *(uint *)(lVar6 + 0x54 + lVar35);
                if ((uVar14 & 0x1400) == 0x400) {
                  String::_opFormat((String *)auStack_e30,kAppend,"+%u",(ulong)(uVar14 >> 0xd & 3));
                }
                if (*(char *)(lVar6 + 0x5b + lVar35) == -1) {
                  if ((*(byte *)(lVar6 + 0x54 + lVar35) & 8) != 0) {
                    String::_opString((String *)auStack_e30,kAppend,"|Out",0xffffffffffffffff);
                  }
                }
                else {
                  String::_opFormat((String *)auStack_e30,kAppend,"|Out=%u");
                }
                uVar14 = *(uint *)(lVar6 + 0x54 + lVar35);
                if ((uVar14 & 0x1800) == 0x800) {
                  String::_opFormat((String *)auStack_e30,kAppend,"+%u",(ulong)(uVar14 >> 0xd & 3));
                  uVar14 = *(uint *)(lVar6 + 0x54 + lVar35);
                }
                if ((uVar14 >> 0x11 & 1) != 0) {
                  String::_opString((String *)auStack_e30,kAppend,"|Last",0xffffffffffffffff);
                  uVar14 = *(uint *)(lVar6 + 0x54 + lVar35);
                }
                if ((uVar14 >> 0x12 & 1) != 0) {
                  String::_opString((String *)auStack_e30,kAppend,"|Kill",0xffffffffffffffff);
                }
                pBVar32 = (BaseRAPass *)auStack_e30;
                String::_opString((String *)auStack_e30,kAppend,"}",0xffffffffffffffff);
                lVar35 = lVar35 + 0x20;
              } while ((ulong)uVar33 << 5 != lVar35);
            }
          }
          iVar29 = (int)auStack_e30 + 1;
          if (0x1e < (byte)auStack_e30[0]) {
            iVar29 = (int)auStack_e30._24_8_;
          }
          iVar29 = Zone::dup((Zone *)(*(long *)&((BaseEmitter *)&pBVar40->super_FuncPass)->
                                                _emitterType + 0xb8),iVar29);
          *(ulong *)(pBVar17 + 0x28) = CONCAT44(extraout_var,iVar29);
          if (pBVar17 == pBVar24) break;
          pBVar17 = *(BaseNode **)(pBVar17 + 8);
        }
      }
      plVar27 = plVar27 + 1;
    } while( true );
  }
  pFVar7 = pBVar40->_func;
  uVar45 = (ulong)(byte)pFVar7->field_0xa8;
  if (uVar45 != 0) {
    lVar6 = **(long **)&(pBVar40->_blocks).field_0x0;
    puVar20 = &pFVar7->field_0xd0;
    puVar39 = &pFVar7->_args->_data[0]._id;
    uVar47 = 0;
    do {
      if (uVar47 == uVar45) {
LAB_00126309:
        pBStack_9e0 = (BaseRAPass *)0x12630e;
        assignArgIndexToWorkRegs();
        goto LAB_0012630e;
      }
      lVar35 = *(long *)&((BaseEmitter *)&pBVar40->super_FuncPass)->_emitterType;
      pAVar8 = pBVar40->_archTraits;
      pBVar18 = (BaseRAPass *)0x0;
      do {
        if (puVar39[(long)pBVar18 * 2 + -1] != 0) {
          uVar33 = puVar39[(long)pBVar18 * 2] - 0x100;
          pBVar37 = (BaseRAPass *)(ulong)uVar33;
          if (uVar33 < *(uint *)(lVar35 + 0x1f0)) {
            pBVar48 = *(BaseRAPass **)(lVar35 + 0x1e8);
            pBVar32 = (BaseRAPass *)
                      (&((BaseEmitter *)&pBVar48->super_FuncPass)->_vptr_BaseEmitter)[uVar33];
            if ((pBVar32 != (BaseRAPass *)0x0) &&
               (pBVar32 = *(BaseRAPass **)&pBVar32->field_0x28, pBVar32 != (BaseRAPass *)0x0)) {
              uVar33 = *(uint *)&((BaseEmitter *)&pBVar32->super_FuncPass)->_vptr_BaseEmitter;
              pBVar48 = (BaseRAPass *)(ulong)uVar33;
              if (*(uint *)(lVar6 + 0x80) <= uVar33) {
                pBStack_9e0 = (BaseRAPass *)0x1262ff;
                assignArgIndexToWorkRegs();
LAB_001262ff:
                pBStack_9e0 = (BaseRAPass *)0x126304;
                assignArgIndexToWorkRegs();
LAB_00126304:
                pBStack_9e0 = (BaseRAPass *)0x126309;
                assignArgIndexToWorkRegs();
                goto LAB_00126309;
              }
              pBVar46 = (BaseRAPass *)(ulong)(uVar33 >> 6);
              pRVar16 = *(RABlock **)(*(long *)(lVar6 + 0x78) + (long)pBVar46 * 8);
              if (((ulong)pRVar16 >> ((ulong)pBVar48 & 0x3f) & 1) != 0) {
                ((Environment *)&pBVar32->field_0x48)->_arch = (Arch)uVar47;
                pBVar32->field_0x49 = (SubArch)pBVar18;
                if (0x1f < uVar47) goto LAB_001262ff;
                uVar33 = *(uint *)(puVar20 + (long)pBVar18 * 4);
                pBVar48 = (BaseRAPass *)(ulong)uVar33;
                if ((uVar33 >> 8 & 1) != 0) {
                  if (0x1fffffff < uVar33) goto LAB_00126304;
                  pRVar16 = (RABlock *)(ulong)(uVar33 >> 0x18);
                  EVar34 = *(EncodingOptions *)&pBVar32->field_0x20 ^
                           (pAVar8->_regSignature)._data[(long)pRVar16]._bits;
                  pBVar37 = (BaseRAPass *)(ulong)EVar34;
                  if ((EVar34 & 0xf00) == kNone) {
                    pBVar48 = (BaseRAPass *)(ulong)(uVar33 >> 0x10);
                    pBVar32->field_0x4b = (Platform)(uVar33 >> 0x10);
                  }
                }
              }
            }
          }
        }
        pBVar18 = (BaseRAPass *)
                  ((long)&((BaseEmitter *)&pBVar18->super_FuncPass)->_vptr_BaseEmitter + 1);
      } while (pBVar18 != (BaseRAPass *)0x4);
      uVar47 = uVar47 + 1;
      puVar39 = puVar39 + 8;
      puVar20 = puVar20 + 0x10;
    } while (uVar47 != uVar45);
  }
  return 0;
  while( true ) {
    pRVar16 = *(RABlock **)(*(long *)&pBVar48->_blocks + (long)pBVar37 * 8);
    pBStack_9a8 = (BaseRAPass *)0x1258c8;
    EVar13 = String::_opFormat((String *)pBVar46,kAssign,"  {#%u}\n",(ulong)*(uint *)(pRVar16 + 8));
    if (EVar13 != 0) goto LAB_00125258;
    pBStack_9a8 = (BaseRAPass *)0x1258de;
    _dumpBlockLiveness(pBVar48,(String *)pBVar46,pRVar16);
    pBVar30 = (BaseBuilder *)(ulong)(byte)SStack_8b0;
    pBVar18 = pBVar32;
    if ((BaseBuilder *)0x1e < (BaseBuilder *)(ulong)(byte)SStack_8b0) {
      pBVar30 = (BaseBuilder *)auStack_8af._7_8_;
      pBVar18 = pBStack_898;
    }
    pBStack_9a8 = (BaseRAPass *)0x12590a;
    pBVar40 = pBStack_938;
    (*((BaseEmitter *)&pBStack_938->super_FuncPass)->_vptr_BaseEmitter[2])
              (pBStack_938,pBVar18,pBVar30);
    pBVar37 = (BaseRAPass *)
              ((long)&((BaseEmitter *)&pBVar37->super_FuncPass)->_vptr_BaseEmitter + 1);
    if (pBStack_920 == pBVar37) break;
LAB_00125899:
    if ((BaseRAPass *)(ulong)*(uint *)&pBVar48->field_0xb8 <= pBVar37) goto LAB_001261aa;
  }
LAB_00125917:
  pBVar48 = pBStack_990;
  pRStack_930 = (RABlock *)(ulong)((int)pRStack_930 + (uint)((int)pRStack_930 == 0));
  pBVar32 = (BaseRAPass *)0x0;
  puVar31 = puStack_980;
  do {
    pBVar18 = pBVar37;
    if ((BaseRAPass *)(ulong)*puVar31 <= pBVar32) goto LAB_0012617d;
    if ((BaseRAPass *)(ulong)ZStack_8e0._size <= pBVar32) goto LAB_00126182;
    this_01 = *(char **)(*(long *)&(pBStack_988->_workRegs).field_0x0 + (long)pBVar32 * 8);
    if (*(uint *)((long)&((BaseRAPass *)this_01)->_iEmitHelper + 4) <
        *(uint *)((long)ZStack_8e0._data + (long)pBVar32 * 4)) {
      pBVar40 = (BaseRAPass *)&((BaseRAPass *)this_01)->field_0x70;
      pBStack_9a8 = (BaseRAPass *)0x1259b1;
      EVar13 = ZoneVectorBase::_reserve
                         ((ZoneVectorBase *)pBVar40,(ZoneAllocator *)pBVar48,8,
                          *(uint *)((long)ZStack_8e0._data + (long)pBVar32 * 4));
      puVar31 = puStack_980;
      if (EVar13 != 0) goto LAB_00125258;
    }
    if ((BaseRAPass *)(ulong)ZStack_900._size <= pBVar32) goto LAB_00126187;
    uVar33 = *(uint *)((long)ZStack_900._data + (long)pBVar32 * 4);
    if (*(uint *)(((BaseRAPass *)this_01)->_formatOptions)._indentation._data < uVar33) {
      this_01 = (char *)&((BaseRAPass *)this_01)->_logger;
      pBStack_9a8 = (BaseRAPass *)0x1259d3;
      pBVar40 = (BaseRAPass *)this_01;
      EVar13 = ZoneVectorBase::_reserve((ZoneVectorBase *)this_01,(ZoneAllocator *)pBVar48,8,uVar33)
      ;
      puVar31 = puStack_980;
      if (EVar13 != 0) goto LAB_00125258;
    }
    pBVar32 = (BaseRAPass *)
              ((long)&((BaseEmitter *)&pBVar32->super_FuncPass)->_vptr_BaseEmitter + 1);
  } while ((BaseRAPass *)pRStack_930 != pBVar32);
LAB_001259fa:
  pBVar46 = pBVar48;
  pBStack_9a8 = (BaseRAPass *)0x125a0a;
  ZoneVector<unsigned_int>::release
            ((ZoneVector<unsigned_int> *)&ZStack_8e0,(ZoneAllocator *)pBVar46);
  pBVar40 = (BaseRAPass *)&ZStack_900;
  pBStack_9a8 = (BaseRAPass *)0x125a1d;
  ZoneVector<unsigned_int>::release((ZoneVector<unsigned_int> *)pBVar40,(ZoneAllocator *)pBVar46);
  pBVar48 = pBVar46;
  if (pBStack_920 != (BaseRAPass *)0x0) {
    uVar45 = 2;
    pBStack_978 = (BaseRAPass *)0x0;
    puVar31 = puStack_980;
LAB_00125a4b:
    if (pBStack_978 < (BaseRAPass *)(ulong)*(uint *)&pBStack_988->field_0xb8) {
      ppBVar42 = *(BaseNode ***)(*(long *)&(pBStack_988->_blocks).field_0x0 + (long)pBStack_978 * 8)
      ;
      if ((*(undefined1 *)((long)ppBVar42 + 0xc) & 2) == 0) goto LAB_00125fcf;
      if (pBStack_978 < (BaseRAPass *)(ulong)(uint)auStack_910._8_4_) {
        uStack_918 = CONCAT44(uStack_918._4_4_,*(undefined4 *)(ppBVar42 + 1));
        pBVar38 = *(BaseRAPass **)(ppBVar42 + 2);
        pBVar18 = *(BaseRAPass **)(ppBVar42 + 3);
        iVar29 = (int)uVar45 + *(int *)(auStack_910._0_8_ + (long)pBStack_978 * 4) * 2;
        *(int *)(ppBVar42 + 4) = (int)uVar45;
        uStack_998 = CONCAT44(uStack_998._4_4_,iVar29);
        *(int *)((long)ppBVar42 + 0x24) = iVar29;
        auStack_970._0_16_ = ZEXT816(0);
        uVar33 = (((RARegCount *)(ppBVar42 + 0x10))->field_0)._packed + 0x3f & 0xffffffc0;
        pBVar48 = (BaseRAPass *)(ulong)uVar33;
        ppBStack_948 = ppBVar42;
        auStack_970._32_8_ = pBVar18;
        if (uVar33 != 0) {
          pBVar32 = (BaseRAPass *)ppBVar42[0xf];
          pRVar19 = (RABlock *)0x0;
          pBVar26 = *(BaseRAPass **)pBVar32;
          while (pBVar32 = (BaseRAPass *)((long)pBVar32 + 8), pBVar26 == (BaseRAPass *)0x0) {
            pRVar19 = pRVar19 + 0x40;
            if (pBVar48 <= pRVar19) goto LAB_00125c2c;
            pBVar26 = *(BaseRAPass **)pBVar32;
          }
          do {
            pBVar37 = (BaseRAPass *)((ulong)&pBVar26[-1].field_0x4af & (ulong)pBVar26);
            pRVar16 = pRVar19;
            while (pBVar37 == (BaseRAPass *)0x0) {
              pRVar16 = pRVar16 + 0x40;
              if (pBVar48 <= pRVar16) {
                pBVar37 = (BaseRAPass *)0x0;
                break;
              }
              pBVar9 = (BaseEmitter *)&pBVar32->super_FuncPass;
              pBVar32 = (BaseRAPass *)&((BaseEmitter *)&pBVar32->super_FuncPass)->_emitterType;
              pBVar37 = (BaseRAPass *)pBVar9->_vptr_BaseEmitter;
            }
            lVar6 = 0;
            if (pBVar26 != (BaseRAPass *)0x0) {
              for (; ((ulong)pBVar26 >> lVar6 & 1) == 0; lVar6 = lVar6 + 1) {
              }
            }
            uVar47 = (ulong)(uint)((int)lVar6 + (int)pRVar19);
            if (*puVar31 <= uVar47) goto LAB_00126191;
            this_01 = *(char **)(*(long *)&(pBStack_988->_workRegs).field_0x0 + uVar47 * 8);
            bVar12 = ((BaseRAPass *)this_01)->field_0x21 & 0xf;
            if (3 < bVar12) goto LAB_00126196;
            *(int *)(auStack_970 + (ulong)bVar12 * 4) =
                 *(int *)(auStack_970 + (ulong)bVar12 * 4) + 1;
            pBVar40 = (BaseRAPass *)&((BaseRAPass *)this_01)->field_0x50;
            uVar43 = (((RegOnly *)&((BaseRAPass *)this_01)->field_0x58)->_signature)._bits;
            if (uVar43 == 0) {
LAB_00125be3:
              if (uVar43 == *(uint32_t *)&((BaseRAPass *)this_01)->field_0x5c) {
                pBStack_9a8 = (BaseRAPass *)0x125b29;
                pBStack_940 = pBVar38;
                uStack_928 = uVar45;
                EVar13 = ZoneVectorBase::_grow
                                   ((ZoneVectorBase *)pBVar40,(ZoneAllocator *)pBVar46,0xc,1);
                if (EVar13 != 0) goto LAB_00125258;
                uVar43 = (((RegOnly *)&((BaseRAPass *)this_01)->field_0x58)->_signature)._bits;
                pBVar38 = pBStack_940;
                ppBVar42 = ppBStack_948;
                puVar31 = puStack_980;
                uVar45 = uStack_928;
                pBVar18 = (BaseRAPass *)auStack_970._32_8_;
                pBVar46 = pBStack_990;
              }
              lVar6 = *(long *)&((OperandSignature *)&((BaseRAPass *)this_01)->field_0x50)->_bits;
              uVar47 = (ulong)uVar43;
              *(int *)(lVar6 + uVar47 * 0xc) = (int)uVar45;
              *(uint32_t *)(lVar6 + 4 + uVar47 * 0xc) = (uint32_t)uStack_998;
              *(undefined4 *)(lVar6 + 8 + uVar47 * 0xc) = 0xff;
              (((RegOnly *)&((BaseRAPass *)this_01)->field_0x58)->_signature)._bits =
                   (((RegOnly *)&((BaseRAPass *)this_01)->field_0x58)->_signature)._bits + 1;
            }
            else {
              if (*(uint *)(*(long *)&((OperandSignature *)pBVar40)->_bits + 4 +
                           (ulong)(uVar43 - 1) * 0xc) < (uint)uVar45) goto LAB_00125be3;
              *(uint32_t *)
               (*(long *)&((OperandSignature *)pBVar40)->_bits + (ulong)(uVar43 - 1) * 0xc + 4) =
                   (uint32_t)uStack_998;
            }
            pRVar19 = pRVar16;
            pBVar26 = pBVar37;
          } while (pBVar37 != (BaseRAPass *)0x0);
        }
LAB_00125c2c:
        uVar33 = 0;
        EVar34 = kNone;
        IVar56 = kNone;
        uVar14 = 0;
        do {
          if ((((BaseEmitter *)&pBVar38->super_FuncPass)->_diagnosticOptions & 0x2000) != kNone) {
            pBVar18 = *(BaseRAPass **)&pBVar38->field_0x20;
            pBVar37 = pBVar18;
            if (pBVar18 == (BaseRAPass *)0x0) goto LAB_001261a5;
            uVar47 = (ulong)((BaseEmitter *)&pBVar18->super_FuncPass)->_diagnosticOptions;
            *(int *)&((BaseEmitter *)&pBVar38->super_FuncPass)->field_0x14 = (int)uVar45;
            *(undefined8 *)&pBVar18->field_0x1c = auStack_970._0_8_;
            *(undefined8 *)&pBVar18->field_0x24 = auStack_970._8_8_;
            if (uVar47 != 0) {
              pBVar48 = (BaseRAPass *)(uVar47 << 5);
              pRVar16 = (RABlock *)0x0;
              pBStack_940 = pBVar38;
              do {
                uVar44 = *(uint *)(&pBVar18->field_0x4c + (long)pRVar16);
                if (*puVar31 <= uVar44) goto LAB_00126132;
                pBVar32 = *(BaseRAPass **)
                           (*(long *)&(pBStack_988->_workRegs).field_0x0 + (ulong)uVar44 * 8);
                if (*(uint *)((long)&pBVar32->_iEmitHelper + 4) <= *(uint *)&pBVar32->_iEmitHelper)
                goto LAB_00126137;
                *(BaseRAPass **)
                 (*(EmitEpilog *)&pBVar32->field_0x70 + (ulong)*(uint *)&pBVar32->_iEmitHelper * 8)
                     = pBStack_940;
                *(int *)&pBVar32->_iEmitHelper = *(int *)&pBVar32->_iEmitHelper + 1;
                if (((byte)*(RABlock *)((long)&pBVar18->field_0x54 + (long)pRVar16) & 2) != 0) {
                  uVar15 = (pBVar32->_formatOptions)._flags;
                  if (*(uint *)(pBVar32->_formatOptions)._indentation._data <= uVar15)
                  goto LAB_00126155;
                  *(BaseRAPass **)
                   (&(pBVar32->_logger->_options)._indentation + (ulong)uVar15 * 2 + -3) =
                       pBStack_940;
                  (pBVar32->_formatOptions)._flags = (pBVar32->_formatOptions)._flags + 1;
                }
                if (*(uint32_t *)&pBVar32->field_0x28 != (uint32_t)uStack_918) {
                  *(uint32_t *)&pBVar32->field_0x28 = 0xffffffff;
                  pBVar32->field_0x24 = (char)*(InstOptions *)&pBVar32->field_0x24 | kOverwrite;
                }
                uVar15 = *(uint *)((long)&pBVar18->field_0x54 + (long)pRVar16);
                if ((uVar15 >> 0x11 & 1) != 0) {
                  if (*(uint *)(ppBVar42 + 0x12) <= uVar44) goto LAB_0012615a;
                  if ((*(ulong *)((long)ppBVar42[0x11] + (ulong)(uVar44 >> 6) * 8) >>
                       ((ulong)uVar44 & 0x3f) & 1) == 0) {
                    uVar15 = uVar15 | 0x40000;
                    *(uint *)((long)&pBVar18->field_0x54 + (long)pRVar16) = uVar15;
                  }
                }
                this_01 = &pBVar32->field_0x50;
                uVar44 = (~uVar15 & 1) + (int)uVar45;
                uVar43 = (((RegOnly *)&pBVar32->field_0x58)->_signature)._bits;
                if (uVar43 == 0) {
LAB_00125d59:
                  if (uVar43 == *(uint32_t *)&pBVar32->field_0x5c) {
                    uStack_8d0 = (BaseNode *)CONCAT44(EVar34,uVar33);
                    pBStack_9a8 = (BaseRAPass *)0x125ed0;
                    pBVar40 = (BaseRAPass *)this_01;
                    uStack_928 = uVar45;
                    IStack_8c8 = IVar56;
                    uStack_8c4 = uVar14;
                    EVar13 = ZoneVectorBase::_grow
                                       ((ZoneVectorBase *)this_01,(ZoneAllocator *)pBStack_990,0xc,1
                                       );
                    if (EVar13 != 0) goto LAB_00125258;
                    uVar43 = (((RegOnly *)&pBVar32->field_0x58)->_signature)._bits;
                    ppBVar42 = ppBStack_948;
                    puVar31 = puStack_980;
                    uVar45 = uStack_928;
                    uVar33 = (uint)uStack_8d0;
                    EVar34 = uStack_8d0._4_4_;
                    IVar56 = IStack_8c8;
                    uVar14 = uStack_8c4;
                  }
                  lVar6 = *(long *)&((OperandSignature *)&pBVar32->field_0x50)->_bits;
                  uVar47 = (ulong)uVar43;
                  *(uint *)(lVar6 + uVar47 * 0xc) = uVar44;
                  *(uint32_t *)(lVar6 + 4 + uVar47 * 0xc) = (uint32_t)uStack_998;
                  *(undefined4 *)(lVar6 + 8 + uVar47 * 0xc) = 0xff;
                  (((RegOnly *)&pBVar32->field_0x58)->_signature)._bits =
                       (((RegOnly *)&pBVar32->field_0x58)->_signature)._bits + 1;
                  bVar12 = pBVar32->field_0x21 & 0xf;
LAB_00125d91:
                  pBVar46 = pBStack_990;
                  if (3 < bVar12) goto LAB_00126141;
                  *(int *)(auStack_970 + (ulong)bVar12 * 4) =
                       *(int *)(auStack_970 + (ulong)bVar12 * 4) + 1;
                  *(int *)((long)(&pBVar18->_formatOptions + -9) + (ulong)bVar12 * 4) =
                       *(int *)((long)(&pBVar18->_formatOptions + -9) + (ulong)bVar12 * 4) + 1;
                  uVar15 = *(uint *)((long)&pBVar18->field_0x54 + (long)pRVar16);
                }
                else {
                  uVar47 = (ulong)(uVar43 - 1);
                  pBVar40 = (BaseRAPass *)(uVar47 * 3);
                  uVar52 = *(uint *)(*(long *)&((OperandSignature *)this_01)->_bits + 4 +
                                    uVar47 * 0xc);
                  if (uVar52 < uVar44) goto LAB_00125d59;
                  *(uint32_t *)(*(long *)&((OperandSignature *)this_01)->_bits + uVar47 * 0xc + 4) =
                       (uint32_t)uStack_998;
                  bVar12 = pBVar32->field_0x21 & 0xf;
                  if (uVar52 <= uVar44) goto LAB_00125d91;
                }
                uVar47 = (ulong)bVar12;
                pBVar46 = pBStack_990;
                if ((uVar15 >> 0x12 & 1) != 0) {
                  uVar43 = (((RegOnly *)&pBVar32->field_0x58)->_signature)._bits;
                  if (uVar43 == 0) goto LAB_0012615f;
                  pBVar40 = *(BaseRAPass **)&((OperandSignature *)this_01)->_bits;
                  *(uint *)((long)&((BaseEmitter *)&pBVar40->super_FuncPass)->_vptr_BaseEmitter +
                           (ulong)(uVar43 - 1) * 0xc + 4) = (int)uVar45 - (uVar15 | 0xfffffffe);
                  if (3 < bVar12) goto LAB_00126164;
                  *(int *)(auStack_970 + uVar47 * 4) = *(int *)(auStack_970 + uVar47 * 4) + -1;
                  ppBVar42 = ppBStack_948;
                }
                PVar4 = (&pBVar18->field_0x5a)[(long)pRVar16];
                if (PVar4 != ~kUnknown) {
                  uVar44 = 1 << (PVar4 & 0x1f);
                  pBVar40 = (BaseRAPass *)(ulong)uVar44;
                  *(uint *)&pBVar32->field_0x2c = *(uint *)&pBVar32->field_0x2c | uVar44;
                  if (pBVar32->field_0x4b == ~kUnknown) {
                    if (3 < bVar12) goto LAB_00126178;
                    if ((*(uint *)((long)(&pBVar18->_formatOptions + -7) + uVar47 * 4 + 8) & uVar44)
                        == 0) {
                      pBVar32->field_0x4b = PVar4;
                    }
                  }
                }
                uVar44 = *(uint *)((long)&pBVar18->field_0x5c + (long)pRVar16);
                if ((uVar44 != 0) &&
                   (*(uint *)&pBVar32->field_0x30 = *(uint *)&pBVar32->field_0x30 & uVar44,
                   (*(InstOptions *)&pBVar32->field_0x24 & kShortForm) != kNone)) {
                  *(uint *)&pBVar32->field_0x34 = *(uint *)&pBVar32->field_0x34 & uVar44;
                }
                uVar44 = *(uint *)((long)&pBVar18->field_0x60 + (long)pRVar16);
                if ((uVar44 != 0) &&
                   (*(uint *)&pBVar32->field_0x30 = *(uint *)&pBVar32->field_0x30 & uVar44,
                   (*(InstOptions *)&pBVar32->field_0x24 & kShortForm) != kNone)) {
                  *(uint *)&pBVar32->field_0x34 = *(uint *)&pBVar32->field_0x34 & uVar44;
                }
                if (3 < bVar12) goto LAB_0012613c;
                if (((uVar15 & 0x40008) == 0) &&
                   (*(uint *)((long)(&pBVar18->_formatOptions + -7) + uVar47 * 4 + 8) != 0)) {
                  *(uint *)&pBVar32->field_0x38 =
                       *(uint *)&pBVar32->field_0x38 |
                       *(uint *)((long)(&pBVar18->_formatOptions + -7) + uVar47 * 4 + 8);
                }
                pRVar16 = pRVar16 + 0x20;
                pBVar38 = pBStack_940;
              } while (pBVar48 != (BaseRAPass *)pRVar16);
            }
            if ((char)((BaseEmitter *)&pBVar38->super_FuncPass)->_diagnosticOptions == 0x12) {
              pFVar7 = pBStack_988->_func;
              bVar21 = *(byte *)((long)&pBVar38->_logger + 5);
              bVar12 = (pFVar7->_frame)._callStackAlignment;
              if (bVar21 < bVar12) {
                bVar21 = bVar12;
              }
              (pFVar7->_frame)._callStackAlignment = bVar21;
              bVar12 = (pFVar7->_frame)._finalStackAlignment;
              if (bVar21 < bVar12) {
                bVar21 = bVar12;
              }
              (pFVar7->_frame)._finalStackAlignment = bVar21;
            }
            pBVar37 = (BaseRAPass *)&pBVar18->field_0x1c;
            uVar44 = -(uint)((int)(*(uint *)pBVar37 ^ 0x80000000) < (int)(uVar33 ^ 0x80000000));
            EVar50 = -(uint)((int)(*(EncodingOptions *)&pBVar18->field_0x20 ^ 0x80000000) <
                            (int)(EVar34 ^ 0x80000000));
            IVar51 = -(uint)((int)(*(InstOptions *)&pBVar18->field_0x24 ^ kX86_InvalidRex) <
                            (int)(IVar56 ^ kX86_InvalidRex));
            uVar15 = -(uint)((int)(*(uint *)&pBVar18->field_0x28 ^ 0x80000000) <
                            (int)(uVar14 ^ 0x80000000));
            uVar33 = uVar33 & uVar44 | ~uVar44 & *(uint *)pBVar37;
            EVar34 = EVar34 & EVar50 | ~EVar50 & *(EncodingOptions *)&pBVar18->field_0x20;
            IVar56 = IVar56 & IVar51 | ~IVar51 & *(InstOptions *)&pBVar18->field_0x24;
            uVar14 = uVar14 & uVar15 | ~uVar15 & *(uint *)&pBVar18->field_0x28;
            uVar45 = (ulong)((int)uVar45 + 2);
            pBVar18 = (BaseRAPass *)auStack_970._32_8_;
          }
          if (pBVar38 == pBVar18) goto LAB_00125f8a;
          pBVar38 = *(BaseRAPass **)&((BaseEmitter *)&pBVar38->super_FuncPass)->_emitterType;
          if (pBVar38 == (BaseRAPass *)0x0) goto LAB_0012618c;
        } while( true );
      }
      goto LAB_001261b4;
    }
    goto LAB_001261af;
  }
LAB_00125fea:
  uVar33 = *(uint *)&pBStack_988->field_0x148;
  lVar6 = *(long *)&(pBStack_988->_workRegs).field_0x0;
  uVar45 = 0;
  do {
    if (uVar45 == uVar33) goto LAB_001261a0;
    lVar35 = *(long *)(lVar6 + uVar45 * 8);
    fVar49 = 0.0;
    if ((ulong)*(uint *)(lVar35 + 0x58) == 0) {
LAB_00126067:
      uVar14 = 0;
    }
    else {
      lVar28 = 0;
      uVar14 = 0;
      do {
        uVar14 = (uVar14 + *(int *)(*(long *)(lVar35 + 0x50) + 4 + lVar28)) -
                 *(int *)(*(long *)(lVar35 + 0x50) + lVar28);
        lVar28 = lVar28 + 0xc;
      } while ((ulong)*(uint *)(lVar35 + 0x58) * 0xc != lVar28);
      if (uVar14 == 0) goto LAB_00126067;
      fVar49 = (float)((double)*(uint *)(lVar35 + 0x78) / (double)uVar14);
    }
    *(uint *)(lVar35 + 0x60) = uVar14;
    *(float *)(lVar35 + 100) = fVar49;
    bVar12 = *(byte *)(*(long *)(lVar35 + 8) + 0xe);
    pBVar40 = (BaseRAPass *)(ulong)bVar12;
    *(float *)(lVar35 + 0x68) = (float)bVar12 * 0.01 + fVar49;
    uVar45 = uVar45 + 1;
  } while ((RABlock *)uVar45 != pRStack_930);
  if (pBStack_938 != (BaseRAPass *)0x0) {
    pBStack_9a8 = (BaseRAPass *)0x1260b3;
    String::clear(&SStack_8b0);
    pBStack_9a8 = (BaseRAPass *)0x1260c0;
    _dumpLiveSpans(pBStack_988,&SStack_8b0);
    pBVar32 = pBStack_898;
    if ((byte)SStack_8b0 < 0x1f) {
LAB_001260fe:
      pBVar32 = (BaseRAPass *)auStack_8af;
    }
    pBStack_9a8 = (BaseRAPass *)0x126111;
    (*((BaseEmitter *)&pBStack_938->super_FuncPass)->_vptr_BaseEmitter[2])(pBStack_938,pBVar32);
    pBVar46 = pBStack_990;
  }
  pBStack_9a8 = (BaseRAPass *)0x126126;
  ZoneVector<unsigned_int>::release
            ((ZoneVector<unsigned_int> *)auStack_910,(ZoneAllocator *)pBVar46);
LAB_00126126:
  EVar13 = 0;
LAB_00125258:
  pBStack_9a8 = (BaseRAPass *)0x125265;
  String::reset(&SStack_8b0);
  return EVar13;
}

Assistant:

Error BaseRAPass::buildCFGViews() noexcept {
#ifndef ASMJIT_NO_LOGGING
  Logger* logger = getLoggerIf(DiagnosticOptions::kRADebugCFG);
  ASMJIT_RA_LOG_FORMAT("[BuildCFGViews]\n");
#endif

  uint32_t count = blockCount();
  if (ASMJIT_UNLIKELY(!count)) return kErrorOk;

  ASMJIT_PROPAGATE(_pov.reserve(allocator(), count));

  ZoneStack<RABlockVisitItem> stack;
  ASMJIT_PROPAGATE(stack.init(allocator()));

  ZoneBitVector visited;
  ASMJIT_PROPAGATE(visited.resize(allocator(), count));

  RABlock* current = _blocks[0];
  uint32_t i = 0;

  for (;;) {
    for (;;) {
      if (i >= current->successors().size())
        break;

      // Skip if already visited.
      RABlock* child = current->successors()[i++];
      if (visited.bitAt(child->blockId()))
        continue;

      // Mark as visited to prevent visiting the same block multiple times.
      visited.setBit(child->blockId(), true);

      // Add the current block on the stack, we will get back to it later.
      ASMJIT_PROPAGATE(stack.append(RABlockVisitItem(current, i)));
      current = child;
      i = 0;
    }

    current->makeReachable();
    current->_povOrder = _pov.size();
    _pov.appendUnsafe(current);

    if (stack.empty())
      break;

    RABlockVisitItem top = stack.pop();
    current = top.block();
    i = top.index();
  }

  ASMJIT_RA_LOG_COMPLEX({
    StringTmp<1024> sb;
    for (RABlock* block : blocks()) {
      sb.clear();
      if (block->hasSuccessors()) {
        sb.appendFormat("  #%u -> {", block->blockId());
        _dumpBlockIds(sb, block->successors());
        sb.append("}\n");
      }
      else {
        sb.appendFormat("  #%u -> {Exit}\n", block->blockId());
      }
      logger->log(sb);
    }
  });

  visited.release(allocator());
  return kErrorOk;
}